

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O3

int array_hash(char *array,int modulus)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if ((long)numvars < 1) {
    iVar2 = 0;
  }
  else {
    lVar3 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 * 0x3e5 + *(int *)(array + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (numvars != lVar3);
  }
  iVar1 = -iVar2;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  return iVar1 % modulus;
}

Assistant:

static int
array_hash(
  const char * array,
  int  modulus)
{
    int val = 0;
    int i;
    int *intarray;

    intarray = (int *) array;

    for (i = 0; i < numvars; i++) {
        val = val * 997 + intarray[i];
    }

    return ((val < 0) ? -val : val) % modulus;

}